

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O2

void __thiscall
icu_63::StringLocalizationInfo::~StringLocalizationInfo(StringLocalizationInfo *this)

{
  void *in_RSI;
  
  ~StringLocalizationInfo(this);
  UMemory::operator_delete((UMemory *)this,in_RSI);
  return;
}

Assistant:

StringLocalizationInfo::~StringLocalizationInfo() {
    for (UChar*** p = (UChar***)data; *p; ++p) {
        // remaining data is simply pointer into our unicode string data.
        if (*p) uprv_free(*p);
    }
    if (data) uprv_free(data);
    if (info) uprv_free(info);
}